

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pk.cpp
# Opt level: O0

void mbedtls_pk_init(mbedtls_pk_context *ctx)

{
  mbedtls_pk_context *ctx_local;
  
  ctx->pk_info = (mbedtls_pk_info_t *)0x0;
  ctx->pk_ctx = (void *)0x0;
  return;
}

Assistant:

void mbedtls_pk_init(mbedtls_pk_context *ctx)
{
    ctx->pk_info = NULL;
    ctx->pk_ctx = NULL;
#if defined(MBEDTLS_USE_PSA_CRYPTO)
    ctx->priv_id = MBEDTLS_SVC_KEY_ID_INIT;
#endif /* MBEDTLS_USE_PSA_CRYPTO */
#if defined(MBEDTLS_PK_USE_PSA_EC_DATA)
    memset(ctx->pub_raw, 0, sizeof(ctx->pub_raw));
    ctx->pub_raw_len = 0;
    ctx->ec_family = 0;
    ctx->ec_bits = 0;
#endif /* MBEDTLS_PK_USE_PSA_EC_DATA */
}